

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O2

void scan_blk_mbmi(AV1_COMMON *cm,MACROBLOCKD *xd,int mi_row,int mi_col,MV_REFERENCE_FRAME *rf,
                  int row_offset,int col_offset,CANDIDATE_MV *ref_mv_stack,uint16_t *ref_mv_weight,
                  uint8_t *ref_match_count,uint8_t *newmv_count,int_mv *gm_mv_candidates,
                  uint8_t *refmv_count)

{
  int iVar1;
  undefined4 in_stack_0000000c;
  POSITION mi_pos;
  
  mi_pos.col = row_offset;
  mi_pos.row = -1;
  iVar1 = is_inside(&xd->tile,mi_col,mi_row,&mi_pos);
  if (iVar1 != 0) {
    add_ref_mv_candidate
              (xd->mi[(long)row_offset - (long)xd->mi_stride],rf,
               (uint8_t *)&gm_mv_candidates->as_int,(uint8_t *)ref_mv_weight,ref_match_count,
               (CANDIDATE_MV *)CONCAT44(in_stack_0000000c,col_offset),(uint16_t *)ref_mv_stack,
               (int_mv *)newmv_count,cm->global_motion,4);
  }
  return;
}

Assistant:

static inline void scan_blk_mbmi(const AV1_COMMON *cm, const MACROBLOCKD *xd,
                                 const int mi_row, const int mi_col,
                                 const MV_REFERENCE_FRAME rf[2], int row_offset,
                                 int col_offset, CANDIDATE_MV *ref_mv_stack,
                                 uint16_t *ref_mv_weight,
                                 uint8_t *ref_match_count, uint8_t *newmv_count,
                                 int_mv *gm_mv_candidates,
                                 uint8_t *refmv_count) {
  const TileInfo *const tile = &xd->tile;
  POSITION mi_pos;

  mi_pos.row = row_offset;
  mi_pos.col = col_offset;

  if (is_inside(tile, mi_col, mi_row, &mi_pos)) {
    const MB_MODE_INFO *const candidate =
        xd->mi[mi_pos.row * xd->mi_stride + mi_pos.col];
    const int len = mi_size_wide[BLOCK_8X8];

    add_ref_mv_candidate(candidate, rf, refmv_count, ref_match_count,
                         newmv_count, ref_mv_stack, ref_mv_weight,
                         gm_mv_candidates, cm->global_motion, 2 * len);
  }  // Analyze a single 8x8 block motion information.
}